

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_collapse.c
# Opt level: O0

REF_STATUS
ref_collapse_edge_tri_quality(REF_GRID ref_grid,REF_INT node0,REF_INT node1,REF_BOOL *allowed)

{
  REF_NODE ref_node_00;
  REF_CELL ref_cell_00;
  bool bVar1;
  uint uVar2;
  REF_INT local_ec;
  REF_INT local_e8;
  int local_e4;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_BOOL will_be_collapsed;
  REF_DBL area;
  REF_DBL quality;
  REF_INT local_b8;
  REF_INT node;
  REF_INT nodes [27];
  REF_INT local_40;
  int local_3c;
  REF_INT cell;
  REF_INT item;
  REF_CELL ref_cell;
  REF_NODE ref_node;
  REF_BOOL *allowed_local;
  REF_INT node1_local;
  REF_INT node0_local;
  REF_GRID ref_grid_local;
  
  ref_node_00 = ref_grid->node;
  *allowed = 0;
  ref_cell_00 = ref_grid->cell[3];
  if ((node1 < 0) || (ref_cell_00->ref_adj->nnode <= node1)) {
    local_e4 = -1;
  }
  else {
    local_e4 = ref_cell_00->ref_adj->first[node1];
  }
  local_3c = local_e4;
  if (local_e4 == -1) {
    local_e8 = -1;
  }
  else {
    local_e8 = ref_cell_00->ref_adj->item[local_e4].ref;
  }
  local_40 = local_e8;
  do {
    if (local_3c == -1) {
      *allowed = 1;
      return 0;
    }
    uVar2 = ref_cell_nodes(ref_cell_00,local_40,&local_b8);
    if (uVar2 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse.c",
             0x324,"ref_collapse_edge_tri_quality",(ulong)uVar2,"nodes");
      return uVar2;
    }
    bVar1 = false;
    for (quality._4_4_ = 0; quality._4_4_ < ref_cell_00->node_per; quality._4_4_ = quality._4_4_ + 1
        ) {
      if (node0 == (&local_b8)[quality._4_4_]) {
        bVar1 = true;
      }
    }
    if (!bVar1) {
      for (quality._4_4_ = 0; quality._4_4_ < ref_cell_00->node_per;
          quality._4_4_ = quality._4_4_ + 1) {
        if (node1 == (&local_b8)[quality._4_4_]) {
          (&local_b8)[quality._4_4_] = node0;
        }
      }
      uVar2 = ref_node_tri_quality(ref_node_00,&local_b8,&area);
      if (uVar2 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse.c",
               0x330,"ref_collapse_edge_tri_quality",(ulong)uVar2,"qual");
        return uVar2;
      }
      if (area < ref_grid->adapt->collapse_quality_absolute) {
        return 0;
      }
      uVar2 = ref_node_tri_area(ref_node_00,&local_b8,(REF_DBL *)&ref_private_macro_code_rss);
      if (uVar2 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse.c",
               0x335,"ref_collapse_edge_tri_quality",(ulong)uVar2,"vol");
        return uVar2;
      }
      if (_ref_private_macro_code_rss <= ref_node_00->min_volume) {
        return 0;
      }
    }
    local_3c = ref_cell_00->ref_adj->item[local_3c].next;
    if (local_3c == -1) {
      local_ec = -1;
    }
    else {
      local_ec = ref_cell_00->ref_adj->item[local_3c].ref;
    }
    local_40 = local_ec;
  } while( true );
}

Assistant:

REF_FCN REF_STATUS ref_collapse_edge_tri_quality(REF_GRID ref_grid,
                                                 REF_INT node0, REF_INT node1,
                                                 REF_BOOL *allowed) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_CELL ref_cell;
  REF_INT item, cell, nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT node;
  REF_DBL quality, area;
  REF_BOOL will_be_collapsed;

  *allowed = REF_FALSE;

  ref_cell = ref_grid_tri(ref_grid);

  each_ref_cell_having_node(ref_cell, node1, item, cell) {
    RSS(ref_cell_nodes(ref_cell, cell, nodes), "nodes");

    will_be_collapsed = REF_FALSE;
    for (node = 0; node < ref_cell_node_per(ref_cell); node++) {
      if (node0 == nodes[node]) {
        will_be_collapsed = REF_TRUE;
      }
    }
    if (will_be_collapsed) continue;

    for (node = 0; node < ref_cell_node_per(ref_cell); node++)
      if (node1 == nodes[node]) nodes[node] = node0;
    RSS(ref_node_tri_quality(ref_node, nodes, &quality), "qual");
    if (quality < ref_grid_adapt(ref_grid, collapse_quality_absolute))
      return REF_SUCCESS;

    /* for twod, should not hurt 3D */
    RSS(ref_node_tri_area(ref_node, nodes, &area), "vol");
    if (area <= ref_node_min_volume(ref_node)) return REF_SUCCESS;
  }

  *allowed = REF_TRUE;

  return REF_SUCCESS;
}